

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorAngle.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsMotorAngle::Update(ChShaftsMotorAngle *this,double mytime,bool update_assets)

{
  double dVar1;
  
  ChPhysicsItem::Update((ChPhysicsItem *)this,mytime,update_assets);
  dVar1 = mytime;
  (*((this->f_rot).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[0xb])();
  (*(this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj._vptr_ChObj
    [0x40])(this);
  (*((this->f_rot).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  this->violation = (dVar1 - mytime) - this->rot_offset;
  return;
}

Assistant:

void ChShaftsMotorAngle::Update(double mytime, bool update_assets) {
    // Inherit time changes of parent class
    ChShaftsMotorBase::Update(mytime, update_assets);

    // Update class data
    this->f_rot->Update(mytime); // call callbacks if any
    violation = GetMotorRot() - f_rot->Get_y(mytime) - rot_offset;
}